

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stack.cpp
# Opt level: O0

bool test5(void)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  int *piVar4;
  undefined1 local_70 [8];
  Stack s3;
  Stack s2;
  int i_1;
  int local_2c;
  undefined1 local_28 [4];
  int i;
  Stack s1;
  int n;
  
  s1.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 1000;
  CP::stack<int>::stack((stack<int> *)local_28);
  for (local_2c = 0;
      local_2c <
      s1.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_2c = local_2c + 1) {
    CP::stack<int>::push((stack<int> *)local_28,&local_2c);
  }
  for (s2.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)s2.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage <
      s1.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ / 2;
      s2.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)s2.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage + 1) {
    CP::stack<int>::pop((stack<int> *)local_28);
  }
  CP::stack<int>::stack
            ((stack<int> *)
             &s3.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(stack<int> *)local_28);
  while( true ) {
    bVar1 = CP::stack<int>::empty((stack<int> *)local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    CP::stack<int>::pop((stack<int> *)local_28);
  }
  CP::stack<int>::stack((stack<int> *)local_70,(stack<int> *)local_28);
  sVar2 = CP::stack<int>::size((stack<int> *)local_28);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar2);
  poVar3 = std::operator<<(poVar3," ");
  bVar1 = CP::stack<int>::empty((stack<int> *)local_28);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sVar2 = CP::stack<int>::size
                    ((stack<int> *)
                     &s3.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar2);
  poVar3 = std::operator<<(poVar3," ");
  bVar1 = CP::stack<int>::empty
                    ((stack<int> *)
                     &s3.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
  piVar4 = CP::stack<int>::top((stack<int> *)
                               &s3.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  sVar2 = CP::stack<int>::size((stack<int> *)local_70);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar2);
  poVar3 = std::operator<<(poVar3," ");
  bVar1 = CP::stack<int>::empty((stack<int> *)local_70);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  CP::stack<int>::~stack((stack<int> *)local_70);
  CP::stack<int>::~stack
            ((stack<int> *)
             &s3.v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  CP::stack<int>::~stack((stack<int> *)local_28);
  return true;
}

Assistant:

bool test5() {
  int n = 1000;
  Stack s1;
  for (int i = 0;i < n;i++) { s1.push(i); }
  for (int i = 0;i < n/2;i++) { s1.pop(); }
  Stack s2 = s1;
  while (!s1.empty()) { s1.pop(); }
  Stack s3(s1);

  cout << s1.size() << " " << s1.empty() << endl;
  cout << s2.size() << " " << s2.empty() << s2.top() << endl;
  cout << s3.size() << " " << s3.empty() << endl;
  return true;
}